

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngdec.c
# Opt level: O3

int ProcessRawProfile(char *profile,size_t profile_len,MetadataPayload *payload)

{
  char cVar1;
  ulong uVar2;
  uint8_t *__ptr;
  long lVar3;
  char *pcVar4;
  uint8_t *puVar5;
  ulong __size;
  char *end;
  char *end_1;
  char local_4b;
  char local_4a;
  char local_49;
  MetadataPayload *local_48;
  char *local_40;
  char *local_38;
  
  if (profile_len != 0 && profile != (char *)0x0) {
    if (*profile == '\n') {
      pcVar4 = profile + 1;
      do {
        cVar1 = *pcVar4;
        if (cVar1 == '\0') break;
        pcVar4 = pcVar4 + 1;
      } while (cVar1 != '\n');
      uVar2 = strtol(pcVar4,&local_40,10);
      if (*local_40 == '\n') {
        pcVar4 = local_40 + 1;
        __size = (ulong)(int)uVar2;
        local_40 = pcVar4;
        __ptr = (uint8_t *)malloc(__size);
        if (__ptr != (uint8_t *)0x0) {
          local_48 = payload;
          if ((uVar2 & 0xffffffff) == 0) {
            uVar2 = 0;
          }
          else {
            uVar2 = 0;
            puVar5 = __ptr;
            do {
              cVar1 = *pcVar4;
              if (cVar1 == '\0') break;
              if (cVar1 != '\n') {
                local_4a = pcVar4[1];
                local_49 = '\0';
                local_4b = cVar1;
                lVar3 = strtol(&local_4b,&local_38,0x10);
                *puVar5 = (uint8_t)lVar3;
                uVar2 = uVar2 + (local_38 == &local_49);
                if (local_38 != &local_49) break;
                pcVar4 = pcVar4 + 1;
                puVar5 = puVar5 + 1;
              }
              pcVar4 = pcVar4 + 1;
            } while (uVar2 < __size);
          }
          if (uVar2 == __size) {
            local_48->bytes = __ptr;
            local_48->size = __size;
            return 1;
          }
          free(__ptr);
          payload = local_48;
        }
        payload->bytes = (uint8_t *)0x0;
        return 0;
      }
    }
    fprintf(stderr,"Malformed raw profile, expected \'\\n\' got \'\\x%.2X\'\n");
  }
  return 0;
}

Assistant:

static int ProcessRawProfile(const char* profile, size_t profile_len,
                             MetadataPayload* const payload) {
  const char* src = profile;
  char* end;
  int expected_length;

  if (profile == NULL || profile_len == 0) return 0;

  // ImageMagick formats 'raw profiles' as
  // '\n<name>\n<length>(%8lu)\n<hex payload>\n'.
  if (*src != '\n') {
    fprintf(stderr, "Malformed raw profile, expected '\\n' got '\\x%.2X'\n",
            *src);
    return 0;
  }
  ++src;
  // skip the profile name and extract the length.
  while (*src != '\0' && *src++ != '\n') {}
  expected_length = (int)strtol(src, &end, 10);
  if (*end != '\n') {
    fprintf(stderr, "Malformed raw profile, expected '\\n' got '\\x%.2X'\n",
            *end);
    return 0;
  }
  ++end;

  // 'end' now points to the profile payload.
  payload->bytes = HexStringToBytes(end, expected_length);
  if (payload->bytes == NULL) return 0;
  payload->size = expected_length;
  return 1;
}